

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfrs.cpp
# Opt level: O0

void __thiscall
icu_63::NFRuleSet::NFRuleSet
          (NFRuleSet *this,RuleBasedNumberFormat *_owner,UnicodeString *descriptions,int32_t index,
          UErrorCode *status)

{
  UBool UVar1;
  char16_t cVar2;
  int32_t iVar3;
  int32_t iVar4;
  __off_t __length;
  bool bVar5;
  ConstChar16Ptr local_a0;
  ConstChar16Ptr local_98;
  UnicodeString local_90;
  int32_t local_4c;
  UnicodeString *pUStack_48;
  int32_t pos;
  UnicodeString *description;
  int32_t i;
  UErrorCode *local_30;
  UErrorCode *status_local;
  UnicodeString *pUStack_20;
  int32_t index_local;
  UnicodeString *descriptions_local;
  RuleBasedNumberFormat *_owner_local;
  NFRuleSet *this_local;
  
  local_30 = status;
  status_local._4_4_ = index;
  pUStack_20 = descriptions;
  descriptions_local = (UnicodeString *)_owner;
  _owner_local = (RuleBasedNumberFormat *)this;
  UnicodeString::UnicodeString(&this->name);
  NFRuleList::NFRuleList(&this->rules,0);
  this->owner = (RuleBasedNumberFormat *)descriptions_local;
  NFRuleList::NFRuleList(&this->fractionRules,10);
  this->fIsFractionRuleSet = '\0';
  this->fIsPublic = '\0';
  this->fIsParseable = '\x01';
  for (description._0_4_ = 0; (int)description < 6; description._0_4_ = (int)description + 1) {
    this->nonNumericalRules[(int)description] = (NFRule *)0x0;
  }
  UVar1 = ::U_FAILURE(*local_30);
  if (UVar1 == '\0') {
    pUStack_48 = pUStack_20 + status_local._4_4_;
    iVar3 = UnicodeString::length(pUStack_48);
    if (iVar3 == 0) {
      *local_30 = U_PARSE_ERROR;
    }
    else {
      cVar2 = UnicodeString::charAt(pUStack_48,0);
      if (cVar2 == L'%') {
        local_4c = UnicodeString::indexOf(pUStack_48,L':');
        if (local_4c == -1) {
          *local_30 = U_PARSE_ERROR;
        }
        else {
          UnicodeString::setTo(&this->name,pUStack_48,0,local_4c);
          do {
            iVar3 = local_4c;
            iVar4 = UnicodeString::length(pUStack_48);
            bVar5 = false;
            if (iVar3 < iVar4) {
              local_4c = local_4c + 1;
              cVar2 = UnicodeString::charAt(pUStack_48,local_4c);
              UVar1 = PatternProps::isWhiteSpace((uint)(ushort)cVar2);
              bVar5 = UVar1 != '\0';
            }
          } while (bVar5);
          UnicodeString::remove(pUStack_48,(char *)0x0);
        }
      }
      else {
        ConstChar16Ptr::ConstChar16Ptr(&local_98,L"%default");
        UnicodeString::UnicodeString(&local_90,'\x01',&local_98,-1);
        UnicodeString::setTo(&this->name,&local_90);
        UnicodeString::~UnicodeString(&local_90);
        ConstChar16Ptr::~ConstChar16Ptr(&local_98);
      }
      iVar3 = UnicodeString::length(pUStack_48);
      if (iVar3 == 0) {
        *local_30 = U_PARSE_ERROR;
      }
      iVar3 = UnicodeString::indexOf(&this->name,L"%%",2,0);
      this->fIsPublic = iVar3 != 0;
      ConstChar16Ptr::ConstChar16Ptr(&local_a0,(char16_t *)gNoparse);
      UVar1 = UnicodeString::endsWith(&this->name,&local_a0,8);
      ConstChar16Ptr::~ConstChar16Ptr(&local_a0);
      if (UVar1 != '\0') {
        this->fIsParseable = '\0';
        iVar3 = UnicodeString::length(&this->name);
        UnicodeString::truncate(&this->name,(char *)(ulong)(iVar3 - 8),__length);
      }
    }
  }
  return;
}

Assistant:

NFRuleSet::NFRuleSet(RuleBasedNumberFormat *_owner, UnicodeString* descriptions, int32_t index, UErrorCode& status)
  : name()
  , rules(0)
  , owner(_owner)
  , fractionRules()
  , fIsFractionRuleSet(FALSE)
  , fIsPublic(FALSE)
  , fIsParseable(TRUE)
{
    for (int32_t i = 0; i < NON_NUMERICAL_RULE_LENGTH; ++i) {
        nonNumericalRules[i] = NULL;
    }

    if (U_FAILURE(status)) {
        return;
    }

    UnicodeString& description = descriptions[index]; // !!! make sure index is valid

    if (description.length() == 0) {
        // throw new IllegalArgumentException("Empty rule set description");
        status = U_PARSE_ERROR;
        return;
    }

    // if the description begins with a rule set name (the rule set
    // name can be omitted in formatter descriptions that consist
    // of only one rule set), copy it out into our "name" member
    // and delete it from the description
    if (description.charAt(0) == gPercent) {
        int32_t pos = description.indexOf(gColon);
        if (pos == -1) {
            // throw new IllegalArgumentException("Rule set name doesn't end in colon");
            status = U_PARSE_ERROR;
        } else {
            name.setTo(description, 0, pos);
            while (pos < description.length() && PatternProps::isWhiteSpace(description.charAt(++pos))) {
            }
            description.remove(0, pos);
        }
    } else {
        name.setTo(UNICODE_STRING_SIMPLE("%default"));
    }

    if (description.length() == 0) {
        // throw new IllegalArgumentException("Empty rule set description");
        status = U_PARSE_ERROR;
    }

    fIsPublic = name.indexOf(gPercentPercent, 2, 0) != 0;

    if ( name.endsWith(gNoparse,8) ) {
        fIsParseable = FALSE;
        name.truncate(name.length()-8); // remove the @noparse from the name
    }

    // all of the other members of NFRuleSet are initialized
    // by parseRules()
}